

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::dynamic_string>::vector
          (vector<crnlib::dynamic_string> *this,vector<crnlib::dynamic_string> *other)

{
  long in_RSI;
  dynamic_string *in_RDI;
  uint i;
  dynamic_string *pSrc;
  dynamic_string *pDst;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  uint in_stack_ffffffffffffffcc;
  uint local_24;
  
  in_RDI->m_buf_size = 0;
  in_RDI->m_len = 0;
  *(undefined4 *)&in_RDI->field_0x4 = 0;
  *(uint *)&in_RDI->m_pStr = 0;
  *(uint *)((long)&in_RDI->m_pStr + 4) = 0;
  increase_capacity((vector<crnlib::dynamic_string> *)in_RDI,in_stack_ffffffffffffffcc,
                    (bool)in_stack_ffffffffffffffcb,(bool)in_stack_ffffffffffffffca);
  *(uint *)&in_RDI->m_pStr = *(uint *)(in_RSI + 8);
  for (local_24 = *(uint *)&in_RDI->m_pStr; local_24 != 0; local_24 = local_24 - 1) {
    helpers::construct<crnlib::dynamic_string,crnlib::dynamic_string>
              (in_RDI,(dynamic_string *)
                      CONCAT44(in_stack_ffffffffffffffcc,
                               CONCAT13(in_stack_ffffffffffffffcb,
                                        CONCAT12(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8
                                                ))));
  }
  return;
}

Assistant:

inline vector(const vector& other)
      : m_p(NULL),
        m_size(0),
        m_capacity(0) {
    increase_capacity(other.m_size, false);

    m_size = other.m_size;

    if (CRNLIB_IS_BITWISE_COPYABLE(T))
      memcpy(m_p, other.m_p, m_size * sizeof(T));
    else {
      T* pDst = m_p;
      const T* pSrc = other.m_p;
      for (uint i = m_size; i > 0; i--)
        helpers::construct(pDst++, *pSrc++);
    }
  }